

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O1

void __thiscall
PrimitiveDisplayer::drawRectangleOutline
          (PrimitiveDisplayer *this,Vec2d origin,Vec2d dimensions,Colour *colour)

{
  GLfloat *pGVar1;
  float fVar2;
  float fVar3;
  undefined8 local_58;
  GLfloat vertices [8];
  Vec2d origin_local;
  Vec2d dimensions_local;
  
  vertices._24_8_ = origin;
  origin_local = dimensions;
  glPushMatrix();
  fVar2 = Vec2d::getX((Vec2d *)(vertices + 6));
  fVar3 = Vec2d::getY((Vec2d *)(vertices + 6));
  glTranslatef(fVar2,fVar3,0);
  pGVar1 = Colour::getColour3fv(colour);
  glColor3fv(pGVar1);
  glShadeModel(0x1d00);
  local_58 = 0;
  vertices[0] = Vec2d::getX(&origin_local);
  vertices[1] = 0.0;
  vertices[2] = Vec2d::getX(&origin_local);
  vertices[3] = Vec2d::getY(&origin_local);
  vertices[4] = 0.0;
  vertices[5] = Vec2d::getY(&origin_local);
  glEnableClientState(0x8074);
  glVertexPointer(2,0x1406,0,&local_58);
  glLineWidth(0x40800000);
  glDrawArrays(2,0,4);
  glDisableClientState(0x8074);
  glPopMatrix();
  return;
}

Assistant:

void PrimitiveDisplayer::drawRectangleOutline(Vec2d origin, Vec2d dimensions, Colour* colour) {
    glPushMatrix();
        glTranslatef(origin.getX(), origin.getY(), 0.f);
    
        glColor3fv(colour->getColour3fv());
    
        glShadeModel(GL_FLAT);
        GLfloat vertices[8] = {
             0                  ,0
            ,dimensions.getX()  ,0
            ,dimensions.getX()  ,dimensions.getY()
            ,0                  ,dimensions.getY()
        };
        glEnableClientState(GL_VERTEX_ARRAY);
        glVertexPointer(2, GL_FLOAT, 0, vertices);
        glLineWidth(4);
        glDrawArrays(GL_LINE_LOOP, 0, 4);
        glDisableClientState(GL_VERTEX_ARRAY);
    glPopMatrix();
}